

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O3

void __thiscall
jsonnet::internal::FodderElement::FodderElement
          (FodderElement *this,Kind kind,uint blanks,uint indent,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *comment)

{
  this->kind = kind;
  this->blanks = blanks;
  this->indent = indent;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->comment,comment);
  if (kind == PARAGRAPH) {
    if ((comment->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish ==
        (comment->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      __assert_fail("kind != PARAGRAPH || comment.size() >= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/lexer.h"
                    ,0x60,
                    "jsonnet::internal::FodderElement::FodderElement(Kind, unsigned int, unsigned int, const std::vector<std::string> &)"
                   );
    }
  }
  else if (kind == INTERSTITIAL) {
    if ((indent != 0 || blanks != 0) ||
       ((long)(comment->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(comment->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start != 0x20)) {
      __assert_fail("kind != INTERSTITIAL || (blanks == 0 && indent == 0 && comment.size() == 1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/lexer.h"
                    ,0x5f,
                    "jsonnet::internal::FodderElement::FodderElement(Kind, unsigned int, unsigned int, const std::vector<std::string> &)"
                   );
    }
  }
  else if ((kind == LINE_END) &&
          (0x20 < (ulong)((long)(comment->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(comment->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start))) {
    __assert_fail("kind != LINE_END || comment.size() <= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/lexer.h",
                  0x5e,
                  "jsonnet::internal::FodderElement::FodderElement(Kind, unsigned int, unsigned int, const std::vector<std::string> &)"
                 );
  }
  return;
}

Assistant:

FodderElement(Kind kind, unsigned blanks, unsigned indent,
                  const std::vector<std::string> &comment)
        : kind(kind), blanks(blanks), indent(indent), comment(comment)
    {
        assert(kind != LINE_END || comment.size() <= 1);
        assert(kind != INTERSTITIAL || (blanks == 0 && indent == 0 && comment.size() == 1));
        assert(kind != PARAGRAPH || comment.size() >= 1);
    }